

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

int main(void)

{
  AudioSource source;
  AudioSource *in_stack_00000018;
  char *in_stack_00000020;
  
  VxSndInit();
  VxSndLoadSound(in_stack_00000020,in_stack_00000018);
  VxSndPlaySound((AudioSource *)0x10134e);
  do {
  } while( true );
}

Assistant:

int main() {
    VxSndInit();
    AudioSource source;
    VxSndLoadSound("sound.mp3", &source);

    //Loops endlessly
    VxSndPlaySound(&source);
    while (true);
}